

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

void __thiscall maths::Matrix::readSolutionsFromRREF(Matrix *this,ostream *os)

{
  uint uVar1;
  double *pdVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  double **ppdVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  Matrix special;
  Matrix particular;
  Matrix R;
  Matrix local_70;
  Matrix local_60;
  Matrix local_50;
  Matrix local_40;
  
  Matrix(&local_50,this);
  ppdVar8 = local_50.p;
  iVar5 = this->rows_;
  cVar3 = (char)os;
  if (iVar5 < 1) {
    bVar4 = true;
    bVar13 = false;
  }
  else {
    bVar4 = true;
    lVar9 = 0;
    bVar13 = false;
    do {
      uVar1 = this->cols_ - 1;
      if (this->cols_ < 2) {
LAB_00117b8d:
        dVar14 = ppdVar8[lVar9][(int)uVar1];
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"NO SOLUTIONS",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
          std::ostream::put(cVar3);
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          bVar13 = true;
          bVar4 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(os,"INFINITE SOLUTIONS",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
          std::ostream::put(cVar3);
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
LAB_00117cde:
          std::ostream::put((char)plVar6);
          bVar13 = true;
          std::ostream::flush();
        }
      }
      else {
        bVar11 = true;
        uVar12 = 0;
        do {
          pdVar2 = ppdVar8[lVar9] + uVar12;
          if (*pdVar2 != 0.0) {
            bVar11 = false;
          }
          if (NAN(*pdVar2)) {
            bVar11 = false;
          }
          uVar12 = uVar12 + 1;
        } while (uVar1 != uVar12);
        if (bVar11) goto LAB_00117b8d;
        if (iVar5 < (int)uVar1) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"INFINITE SOLUTIONS",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
          std::ostream::put(cVar3);
          plVar6 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          goto LAB_00117cde;
        }
      }
      if (bVar13) break;
      lVar9 = lVar9 + 1;
      iVar5 = this->rows_;
    } while (lVar9 < iVar5);
  }
  if (!bVar13) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"UNIQUE SOLUTION",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    plVar6 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  if (bVar4) {
    Matrix(&local_60,this->cols_ + -1,1);
    Matrix(&local_70,this->cols_ + -1,1);
    if (0 < this->rows_) {
      lVar9 = 0;
      do {
        if (1 < this->cols_) {
          uVar12 = (ulong)(this->cols_ - 1);
          lVar10 = 0;
          bVar4 = false;
          bVar13 = false;
          do {
            dVar14 = local_50.p[lVar9][lVar10];
            if ((dVar14 != 0.0) || (NAN(dVar14))) {
              if (bVar13) {
                if (!bVar4) {
                  Matrix(&local_40,(int)uVar12,1);
                  operator=(&local_70,&local_40);
                  ~Matrix(&local_40);
                  bVar4 = true;
                }
                dVar14 = -local_50.p[lVar9][lVar10];
                ppdVar8 = local_70.p;
              }
              else {
                dVar14 = local_50.p[lVar9][(int)uVar12];
                bVar13 = true;
                ppdVar8 = local_60.p;
              }
              *ppdVar8[lVar10] = dVar14;
            }
            lVar10 = lVar10 + 1;
            uVar12 = (long)this->cols_ - 1;
          } while (lVar10 < (long)uVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"Special solution:",0x11);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
        std::ostream::put(cVar3);
        poVar7 = (ostream *)std::ostream::flush();
        operator<<(poVar7,&local_70);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->rows_);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"Particular solution:",0x14);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar7 = (ostream *)std::ostream::flush();
    operator<<(poVar7,&local_60);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    ~Matrix(&local_70);
    ~Matrix(&local_60);
  }
  ~Matrix(&local_50);
  return;
}

Assistant:

void Matrix::readSolutionsFromRREF(ostream& os)
{
    Matrix R(*this);

    // print number of solutions
    bool hasSolutions = true;
    bool doneSearching = false;
    int i = 0;
    while (!doneSearching && i < rows_)
    {
        bool allZeros = true;
        for (int j = 0; j < cols_ - 1; ++j) {
            if (R(i, j) != 0)
                allZeros = false;
        }
        if (allZeros && R(i, cols_ - 1) != 0) {
            hasSolutions = false;
            os << "NO SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (allZeros && R(i, cols_ - 1) == 0) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        } else if (rows_ < cols_ - 1) {
            os << "INFINITE SOLUTIONS" << endl << endl;
            doneSearching = true;
        }
        i++;
    }
    if (!doneSearching)
        os << "UNIQUE SOLUTION" << endl << endl;

    // get solutions if they exist
    if (hasSolutions)
    {
        Matrix particular(cols_ - 1, 1);
        Matrix special(cols_ - 1, 1);

        for (int i = 0; i < rows_; ++i) {
            bool pivotFound = false;
            bool specialCreated = false;
            for (int j = 0; j < cols_ - 1; ++j) {
                if (R(i, j) != 0) {
                    // if pivot variable, add b to particular
                    if (!pivotFound) {
                        pivotFound = true;
                        particular(j, 0) = R(i, cols_ - 1);
                    } else { // otherwise, add to special solution
                        if (!specialCreated) {
                            special = Matrix(cols_ - 1, 1);
                            specialCreated = true;
                        }
                        special(j, 0) = -1 * R(i, j);
                    }
                }
            }
            os << "Special solution:" << endl << special << endl;
        }
        os << "Particular solution:" << endl << particular << endl;
    }
}